

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O0

void test_key(string *test_dir)

{
  ostream *poVar1;
  long lVar2;
  short *psVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *prVar6;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  key k3;
  ostringstream oss_7;
  ostringstream oss_6;
  key k2;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  key k;
  char *in_stack_ffffffffffffe7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7e8;
  string local_15b8 [32];
  ostringstream local_1598 [383];
  undefined1 local_1419;
  string local_1418 [32];
  ostringstream local_13f8 [376];
  string local_1280 [39];
  undefined1 local_1259;
  string local_1258 [32];
  ostringstream local_1238 [383];
  undefined1 local_10b9;
  string local_10b8 [32];
  ostringstream local_1098 [383];
  undefined1 local_f19;
  string local_f18 [32];
  ostringstream local_ef8 [376];
  key local_d80 [23];
  undefined1 local_d69;
  string local_d68 [32];
  ostringstream local_d48 [383];
  undefined1 local_bc9;
  string local_bc8 [32];
  ostringstream local_ba8 [376];
  key local_a30 [23];
  undefined1 local_a19;
  string local_a18 [32];
  ostringstream local_9f8 [383];
  undefined1 local_879;
  string local_878 [32];
  ostringstream local_858 [383];
  allocator local_6d9;
  string local_6d8 [32];
  key local_6b8 [23];
  undefined1 local_6a1;
  string local_6a0 [32];
  ostringstream local_680 [383];
  undefined1 local_501;
  string local_500 [32];
  ostringstream local_4e0 [383];
  undefined1 local_361;
  string local_360 [32];
  ostringstream local_340 [383];
  undefined1 local_1c1;
  string local_1c0 [32];
  ostringstream local_1a0 [392];
  key local_18 [24];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"- Testing key");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  cppcms::crypto::key::key(local_18);
  cppcms::crypto::key::set_hex((char *)local_18,0x1136aa);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa4);
    std::operator<<(poVar1," k.size()==2");
    local_1c1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1c0);
    local_1c1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar3 = (short *)cppcms::crypto::key::data();
  if (*psVar3 != -0x4456) {
    std::__cxx11::ostringstream::ostringstream(local_340);
    poVar1 = std::operator<<((ostream *)local_340,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa5);
    std::operator<<(poVar1," memcmp(k.data(),\"\\xaa\\xbb\",2)==0");
    local_361 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_360);
    local_361 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::set(local_18,0x1136aa);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 4) {
    std::__cxx11::ostringstream::ostringstream(local_4e0);
    poVar1 = std::operator<<((ostream *)local_4e0,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa7);
    std::operator<<(poVar1," k.size()==4");
    local_501 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_500);
    local_501 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar4 = (int *)cppcms::crypto::key::data();
  if (*piVar4 != 0x62626161) {
    std::__cxx11::ostringstream::ostringstream(local_680);
    poVar1 = std::operator<<((ostream *)local_680,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa8);
    std::operator<<(poVar1," memcmp(k.data(),\"aabb\",4)==0");
    local_6a1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_6a0);
    local_6a1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"ab",&local_6d9);
  cppcms::crypto::key::key(local_6b8,local_6d8);
  cppcms::crypto::key::operator=(local_18,local_6b8);
  cppcms::crypto::key::~key(local_6b8);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_858);
    poVar1 = std::operator<<((ostream *)local_858,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xaa);
    std::operator<<(poVar1," k.size()==1");
    local_879 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_878);
    local_879 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)cppcms::crypto::key::data();
  if (*pcVar5 != -0x55) {
    std::__cxx11::ostringstream::ostringstream(local_9f8);
    poVar1 = std::operator<<((ostream *)local_9f8,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xab);
    std::operator<<(poVar1," *k.data()==\'\\xAB\'");
    local_a19 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_a18);
    local_a19 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::key(local_a30,local_18);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_ba8);
    poVar1 = std::operator<<((ostream *)local_ba8,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xad);
    std::operator<<(poVar1," k2.size()==1");
    local_bc9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_bc8);
    local_bc9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)cppcms::crypto::key::data();
  if (*pcVar5 == -0x55) {
    cppcms::crypto::key::key(local_d80);
    lVar2 = cppcms::crypto::key::size();
    if (lVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_ef8);
      poVar1 = std::operator<<((ostream *)local_ef8,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb0);
      std::operator<<(poVar1," k3.size()==0");
      local_f19 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_f18);
      local_f19 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::crypto::key::operator=(local_d80,local_18);
    lVar2 = cppcms::crypto::key::size();
    if (lVar2 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_1098);
      poVar1 = std::operator<<((ostream *)local_1098,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb2);
      std::operator<<(poVar1," k3.size()==1");
      local_10b9 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_10b8);
      local_10b9 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar5 = (char *)cppcms::crypto::key::data();
    if (*pcVar5 != -0x55) {
      std::__cxx11::ostringstream::ostringstream(local_1238);
      poVar1 = std::operator<<((ostream *)local_1238,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb3);
      std::operator<<(poVar1," *k3.data()==\'\\xAB\'");
      local_1259 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_1258);
      local_1259 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator+(in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e0);
    cppcms::crypto::key::read_from_file((string *)local_18);
    std::__cxx11::string::~string(local_1280);
    lVar2 = cppcms::crypto::key::size();
    if (lVar2 == 4) {
      piVar4 = (int *)cppcms::crypto::key::data();
      if (*piVar4 == -0x2233fe55) {
        cppcms::crypto::key::~key(local_d80);
        cppcms::crypto::key::~key(local_a30);
        cppcms::crypto::key::~key(local_18);
        return;
      }
      std::__cxx11::ostringstream::ostringstream(local_1598);
      poVar1 = std::operator<<((ostream *)local_1598,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb6);
      std::operator<<(poVar1," memcmp(k.data(),\"\\xab\\x01\\xcc\\xdd\",4)==0");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_15b8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream(local_13f8);
    poVar1 = std::operator<<((ostream *)local_13f8,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb5);
    std::operator<<(poVar1," k.size()==4");
    local_1419 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1418);
    local_1419 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_d48);
  poVar1 = std::operator<<((ostream *)local_d48,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xae);
  std::operator<<(poVar1," *k2.data()==\'\\xAB\'");
  local_d69 = 1;
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar6,local_d68);
  local_d69 = 0;
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_key(std::string test_dir)
{
	std::cout << "- Testing key" << std::endl;
	cppcms::crypto::key k;
	k.set_hex("aabb",4);
	TEST(k.size()==2);
	TEST(memcmp(k.data(),"\xaa\xbb",2)==0);
	k.set("aabb",4);
	TEST(k.size()==4);
	TEST(memcmp(k.data(),"aabb",4)==0);
	k=cppcms::crypto::key(std::string("ab"));
	TEST(k.size()==1);
	TEST(*k.data()=='\xAB');
	cppcms::crypto::key k2(k);
	TEST(k2.size()==1);
	TEST(*k2.data()=='\xAB');
	cppcms::crypto::key k3;
	TEST(k3.size()==0);
	k3=k;
	TEST(k3.size()==1);
	TEST(*k3.data()=='\xAB');
	k.read_from_file(test_dir+"/sample_key.txt");
	TEST(k.size()==4);
	TEST(memcmp(k.data(),"\xab\x01\xcc\xdd",4)==0);
}